

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msghash32)

{
  int iVar1;
  long in_RCX;
  secp256k1_ecdsa_recoverable_signature *in_RDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  int recid;
  secp256k1_scalar m;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  int in_stack_0000012c;
  secp256k1_scalar *in_stack_00000130;
  secp256k1_ge *in_stack_00000138;
  secp256k1_scalar *in_stack_00000140;
  secp256k1_scalar *in_stack_00000148;
  secp256k1_ge *in_stack_ffffffffffffff18;
  secp256k1_callback *in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff28;
  secp256k1_scalar *in_stack_ffffffffffffff30;
  secp256k1_scalar local_c0;
  secp256k1_scalar local_a0 [4];
  void *local_18;
  int local_4;
  
  if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_ecdsa_recoverable_signature_load
              (in_RDI,local_a0,&local_c0,(int *)&stack0xffffffffffffff1c,in_RDX);
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20)
    ;
    iVar1 = secp256k1_ecdsa_sig_recover
                      (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                       in_stack_0000012c);
    if (iVar1 == 0) {
      memset(local_18,0,0x40);
      local_4 = 0;
    }
    else {
      secp256k1_pubkey_save((secp256k1_pubkey *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
      ;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    if (secp256k1_ecdsa_sig_recover(&r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}